

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O0

object_ptr __thiscall mjs::global_object::validate_object(global_object *this,value *v)

{
  value_type vVar1;
  object_ptr *p;
  native_error_exception *this_00;
  value *in_RDX;
  undefined8 extraout_RDX;
  object_ptr oVar2;
  wstring local_208 [32];
  wstring_view local_1e8;
  wstring local_1d8;
  wstring_view local_1b8 [2];
  wostringstream local_198 [8];
  wostringstream woss;
  value *v_local;
  global_object *this_local;
  
  vVar1 = value::type(in_RDX);
  if (vVar1 == object) {
    p = value::object_value(in_RDX);
    gc_heap_ptr<mjs::object>::gc_heap_ptr((gc_heap_ptr<mjs::object> *)this,p);
    oVar2.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
    oVar2.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
    return (object_ptr)oVar2.super_gc_heap_ptr_untyped;
  }
  std::__cxx11::wostringstream::wostringstream(local_198);
  debug_print((wostream *)local_198,in_RDX,2,1,0);
  std::operator<<((wostream *)local_198," is not an object");
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  stack_trace_abi_cxx11_(&local_1d8,(global_object *)v);
  local_1b8[0] = (wstring_view)
                 std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_1d8);
  std::__cxx11::wostringstream::str();
  local_1e8 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_208);
  native_error_exception::native_error_exception(this_00,type,local_1b8,&local_1e8);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

object_ptr global_object::validate_object(const value& v) const {
    if (v.type() == value_type::object) {
        return v.object_value();
    }
    std::wostringstream woss;
    mjs::debug_print(woss, v, 2, 1);
    woss << " is not an object";
    throw native_error_exception(native_error_type::type, stack_trace(), woss.str());
}